

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_unrolling.cpp
# Opt level: O2

vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
* __thiscall
optimization::loop_unrolling::Rewriter::get_insts
          (vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
           *__return_storage_ptr__,Rewriter *this,int times,VarId *new_change_var)

{
  map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
  *this_00;
  uint32_t uVar1;
  pointer puVar2;
  Inst *pIVar3;
  BasicBlk *pBVar4;
  int iVar5;
  pointer puVar6;
  undefined4 extraout_var;
  __normal_iterator<mir::inst::VarId_*,_std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>_>
  __position;
  mapped_type *pmVar7;
  undefined4 extraout_var_00;
  size_type sVar8;
  _Rb_tree_node_base *p_Var9;
  pointer *__ptr;
  _Head_base<0UL,_mir::inst::Inst_*,_false> _Var10;
  Inst *pIVar11;
  int iVar12;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  _Head_base<0UL,_mir::inst::Inst_*,_false> local_f8;
  Rewriter *local_f0;
  pointer local_e8;
  vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
  *local_e0;
  uint32_t local_d8;
  int local_d4;
  uint32_t local_d0;
  uint32_t local_cc;
  _func_int **local_c8;
  VarId *local_c0;
  undefined1 local_b8 [24];
  _Rb_tree_node_base *local_a0;
  _Base_ptr local_88;
  VarId *local_80;
  Displayable local_78;
  VarId var;
  undefined **local_60;
  uint32_t local_58;
  undefined **local_50;
  uint32_t local_48;
  undefined **local_40;
  uint32_t local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = &this->var_map;
  local_88 = (_Base_ptr)&this->phi_var_pair;
  if (times < 1) {
    times = 0;
  }
  local_80 = &this->change_var;
  local_c8 = (_func_int **)&PTR_display_001db3b8;
  local_d8 = 0;
  iVar12 = 0;
  local_f0 = this;
  local_e0 = (vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
              *)__return_storage_ptr__;
  local_d4 = times;
  local_c0 = new_change_var;
  do {
    if (iVar12 == local_d4) {
      puVar6 = *(pointer *)local_e0;
      if (*(pointer *)(local_e0 + 8) != puVar6) {
        iVar12 = (*(((puVar6->_M_t).
                     super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                     .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                   super_Displayable)._vptr_Displayable[1])();
        if (iVar12 != 7) {
          __assert_fail("inst->inst_kind() == mir::inst::InstKind::Phi",
                        "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/optimization/loop_unrolling.cpp"
                        ,0x5d,
                        "std::vector<std::unique_ptr<mir::inst::Inst>> optimization::loop_unrolling::Rewriter::get_insts(int, mir::inst::VarId &)"
                       );
        }
        pIVar3 = (puVar6->_M_t).
                 super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
                 super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                 super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl;
        pIVar11 = (Inst *)0x0;
        if ((pIVar3->super_Displayable)._vptr_Displayable == local_c8) {
          pIVar11 = pIVar3;
        }
        local_b8._8_4_ = local_c0->id;
        local_b8._0_8_ = &PTR_display_001d90d0;
        std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::
        emplace_back<mir::inst::VarId>
                  ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                   &pIVar11[1].dest.id,(VarId *)local_b8);
      }
      pBVar4 = local_f0->blk;
      if ((pBVar4->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload
          .super__Optional_payload_base<mir::inst::VarId>._M_engaged == false) {
        (pBVar4->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
        super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.super_Displayable.
        _vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
        (pBVar4->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
        super__Optional_payload_base<mir::inst::VarId>._M_engaged = true;
      }
      (pBVar4->jump).cond_or_ret.super__Optional_base<mir::inst::VarId,_false,_false>._M_payload.
      super__Optional_payload_base<mir::inst::VarId>._M_payload._M_value.id = local_d8;
      return (vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
              *)local_e0;
    }
    std::
    _Rb_tree<mir::inst::VarId,_std::pair<const_mir::inst::VarId,_mir::inst::VarId>,_std::_Select1st<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
    ::clear(&this_00->_M_t);
    if (iVar12 != 0) {
      std::
      _Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,mir::inst::VarId>,std::_Select1st<std::pair<mir::inst::VarId_const,mir::inst::VarId>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,mir::inst::VarId>>>
      ::_M_emplace_unique<std::pair<mir::inst::VarId,mir::inst::VarId>&>
                ((_Rb_tree<mir::inst::VarId,std::pair<mir::inst::VarId_const,mir::inst::VarId>,std::_Select1st<std::pair<mir::inst::VarId_const,mir::inst::VarId>>,std::less<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,mir::inst::VarId>>>
                  *)this_00,(pair<mir::inst::VarId,_mir::inst::VarId> *)local_88);
    }
    puVar2 = (local_f0->blk->inst).
             super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar6 = (local_f0->blk->inst).
                  super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar6 != puVar2; puVar6 = puVar6 + 1)
    {
      iVar5 = (*(((puVar6->_M_t).
                  super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t
                  .super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->super_Displayable).
                _vptr_Displayable[1])();
      if (iVar5 != 4) {
        local_40 = &PTR_display_001d90d0;
        local_38 = (((puVar6->_M_t).
                     super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                     .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->dest).id;
        copy_var((Rewriter *)local_b8,(VarId *)local_f0);
      }
    }
    local_78._vptr_Displayable =
         (_func_int **)
         (local_f0->blk->inst).
         super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    puVar6 = (local_f0->blk->inst).
             super__Vector_base<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    while (puVar6 != (pointer)local_78._vptr_Displayable) {
      local_e8 = puVar6;
      iVar5 = (*(((puVar6->_M_t).
                  super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t
                  .super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                  super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->super_Displayable).
                _vptr_Displayable[1])();
      puVar6 = local_e8;
      if (iVar5 == 7) {
        if (iVar12 == 0) {
          local_b8._0_4_ =
               (*(((local_e8->_M_t).
                   super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
                   super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->super_Displayable)
                 ._vptr_Displayable[6])();
          local_b8._4_4_ = extraout_var;
          _Var10._M_head_impl = (Inst *)local_b8._0_8_;
          if (*(_func_int ***)local_b8._0_8_ != local_c8) {
            _Var10._M_head_impl = (Inst *)0x0;
          }
          __position = std::
                       __find_if<__gnu_cxx::__normal_iterator<mir::inst::VarId*,std::vector<mir::inst::VarId,std::allocator<mir::inst::VarId>>>,__gnu_cxx::__ops::_Iter_equals_val<mir::inst::VarId_const>>
                                 ((((shared_ptr<mir::types::FunctionTy> *)
                                   ((long)_Var10._M_head_impl + 0x28))->
                                  super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>
                                  )._M_ptr,((_Var10._M_head_impl + 0x30)->super_Displayable).
                                           _vptr_Displayable,local_80);
          std::vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_>::erase
                    ((vector<mir::inst::VarId,_std::allocator<mir::inst::VarId>_> *)
                     ((long)_Var10._M_head_impl + 0x28),(const_iterator)__position._M_current);
          pmVar7 = std::
                   map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                   ::at(this_00,(key_type *)(local_b8._0_8_ + 8));
          *(uint32_t *)(local_b8._0_8_ + 0x10) = pmVar7->id;
          std::
          vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
          ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                    (local_e0,(unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                              local_b8);
          _Var10._M_head_impl = (Inst *)local_b8._0_8_;
          goto LAB_00149874;
        }
      }
      else {
        iVar5 = (*(((local_e8->_M_t).
                    super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                    .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                  super_Displayable)._vptr_Displayable[6])();
        local_f8._M_head_impl = (Inst *)CONCAT44(extraout_var_00,iVar5);
        local_cc = (((puVar6->_M_t).
                     super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                     .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->dest).id;
        local_d0 = (local_f0->change_var).id;
        (*((local_f8._M_head_impl)->super_Displayable)._vptr_Displayable[2])
                  (local_b8,local_f8._M_head_impl);
        for (p_Var9 = local_a0; p_Var9 != (_Rb_tree_node_base *)(local_b8 + 8);
            p_Var9 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var9)) {
          var.super_Displayable._vptr_Displayable = (_func_int **)&PTR_display_001d90d0;
          var.id = *(uint32_t *)&p_Var9[1]._M_parent;
          sVar8 = std::
                  map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                  ::count(this_00,&var);
          _Var10._M_head_impl = local_f8._M_head_impl;
          if (sVar8 != 0) {
            local_50 = &PTR_display_001d90d0;
            local_48 = var.id;
            pmVar7 = std::
                     map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                     ::at(this_00,&var);
            local_60 = &PTR_display_001d90d0;
            local_58 = pmVar7->id;
            (*((_Var10._M_head_impl)->super_Displayable)._vptr_Displayable[3])
                      (_Var10._M_head_impl,&local_50,&local_60);
          }
        }
        std::
        _Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
        ::~_Rb_tree((_Rb_tree<mir::inst::VarId,_mir::inst::VarId,_std::_Identity<mir::inst::VarId>,_std::less<mir::inst::VarId>,_std::allocator<mir::inst::VarId>_>
                     *)local_b8);
        sVar8 = std::
                map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                ::count(this_00,&(local_f8._M_head_impl)->dest);
        if (sVar8 != 0) {
          pmVar7 = std::
                   map<mir::inst::VarId,_mir::inst::VarId,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
                   ::at(this_00,&(local_f8._M_head_impl)->dest);
          ((local_f8._M_head_impl)->dest).id = pmVar7->id;
        }
        if (local_cc == local_d0) {
          uVar1 = ((local_f8._M_head_impl)->dest).id;
          local_c0->id = uVar1;
          (local_f0->phi_var_pair).second.id = uVar1;
        }
        iVar5 = (*(((local_e8->_M_t).
                    super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>.
                    _M_t.
                    super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>
                    .super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl)->
                  super_Displayable)._vptr_Displayable[1])();
        if ((iVar5 == 1) &&
           ((local_e8->_M_t).
            super___uniq_ptr_impl<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>._M_t.
            super__Tuple_impl<0UL,_mir::inst::Inst_*,_std::default_delete<mir::inst::Inst>_>.
            super__Head_base<0UL,_mir::inst::Inst_*,_false>._M_head_impl[3].dest.id == 7)) {
          local_d8 = ((local_f8._M_head_impl)->dest).id;
        }
        std::
        vector<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>,std::allocator<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>>
        ::emplace_back<std::unique_ptr<mir::inst::Inst,std::default_delete<mir::inst::Inst>>>
                  (local_e0,(unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            &local_f8);
        _Var10._M_head_impl = local_f8._M_head_impl;
LAB_00149874:
        if ((MirFunction *)_Var10._M_head_impl != (MirFunction *)0x0) {
          (*(((MirFunction *)_Var10._M_head_impl)->super_Displayable)._vptr_Displayable[5])();
        }
      }
      puVar6 = local_e8 + 1;
    }
    iVar12 = iVar12 + 1;
  } while( true );
}

Assistant:

std::vector<std::unique_ptr<mir::inst::Inst>> get_insts(
      int times, mir::inst::VarId& new_change_var) {
    std::vector<std::unique_ptr<mir::inst::Inst>> res;
    auto cond = mir::inst::VarId(0);
    for (int i = 0; i < times; i++) {
      var_map.clear();
      if (i) {
        var_map.insert(phi_var_pair);
      }
      for (auto& inst : blk.inst) {
        if (inst->inst_kind() != mir::inst::InstKind::Store) {
          copy_var(inst->dest);
        }
      }
      for (auto& inst : blk.inst) {
        if (inst->inst_kind() == mir::inst::InstKind::Phi) {
          if (i == 0) {
            auto ptr = std::unique_ptr<mir::inst::Inst>(inst->deep_copy());
            auto& i = *ptr;
            auto phi = dynamic_cast<mir::inst::PhiInst*>(&i);
            phi->vars.erase(
                std::find(phi->vars.begin(), phi->vars.end(), change_var));
            ptr->dest = var_map.at(ptr->dest);
            res.push_back(std::move(ptr));
          }
          continue;
        } else {
          auto ptr = std::unique_ptr<mir::inst::Inst>(inst->deep_copy());
          bool flag = inst->dest == change_var;
          for (auto var : ptr->useVars()) {
            if (var_map.count(var)) ptr->replace(var, var_map.at(var));
          }
          if (var_map.count(ptr->dest)) {
            ptr->dest = var_map.at(ptr->dest);
          }
          if (flag) {
            new_change_var = ptr->dest;
            phi_var_pair.second = ptr->dest;
          }
          if (inst->inst_kind() == mir::inst::InstKind::Op) {
            auto& i = *inst;
            auto opist = dynamic_cast<mir::inst::OpInst*>(&i);
            if (opist->op == mir::inst::Op::Lt) {
              cond = ptr->dest;
            }
          }
          res.push_back(std::move(ptr));
        }
      }
    }
    if (res.size()) {
      auto& inst = res.front();
      assert(inst->inst_kind() == mir::inst::InstKind::Phi);
      auto& i = *inst;
      auto phi = dynamic_cast<mir::inst::PhiInst*>(&i);
      phi->vars.push_back(mir::inst::VarId(new_change_var.id));
    }
    blk.jump.cond_or_ret = cond;
    return res;
  }